

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<1>_>
             *this,wchar_t **it)

{
  size_t sVar1;
  wchar_t *pwVar2;
  wchar_t *in_RSI;
  unsigned_long in_RDI;
  wchar_t *unaff_retaddr;
  wchar_t **in_stack_ffffffffffffffd8;
  bin_writer<1> *in_stack_ffffffffffffffe0;
  unsigned_long __n;
  
  __n = in_RDI;
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    in_stack_ffffffffffffffe0 =
         (bin_writer<1> *)basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    pwVar2 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                       ((char *)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                        (wchar_t *)0x1f9f2d);
    *(wchar_t **)in_RSI = pwVar2;
  }
  pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>(unaff_retaddr,__n,in_RSI);
  *(wchar_t **)in_RSI = pwVar2;
  int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }